

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.h
# Opt level: O3

void __thiscall
google::protobuf::internal::ArenaStringPtr::
Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
          (ArenaStringPtr *this,char *param_2,undefined8 param_3)

{
  allocator<char> local_39;
  long *local_38 [2];
  long local_28 [2];
  
  std::__cxx11::string::string<std::allocator<char>>((string *)local_38,param_2,&local_39);
  Set(this,(string *)local_38,param_3);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  return;
}

Assistant:

void Set(FirstParam p1, const char* str, ::google::protobuf::Arena* arena) {
    Set(p1, ConstStringParam(str), arena);
  }